

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.h
# Opt level: O1

Matrix4x4 * __thiscall
CS248::DynamicScene::SceneObject::getObjectToWorld
          (Matrix4x4 *__return_storage_ptr__,SceneObject *this)

{
  Matrix4x4 T;
  Matrix4x4 scaleXform;
  Matrix4x4 RZ;
  Matrix4x4 RY;
  Matrix4x4 RX;
  Vector3D local_468;
  Vector3D local_448;
  Matrix4x4 local_430;
  Matrix4x4 local_3b0;
  Matrix4x4 local_330;
  Matrix4x4 local_2b0;
  Matrix4x4 local_230;
  Matrix4x4 local_1b0;
  Matrix4x4 local_130;
  Matrix4x4 local_b0;
  
  local_448.x = (this->position_).x;
  local_448.y = (this->position_).y;
  local_448.z = (this->position_).z;
  Matrix4x4::translation(&local_448);
  Matrix4x4::rotation(&local_b0,(this->rotation_).x * 0.01745329238474369,X);
  Matrix4x4::rotation(&local_130,(this->rotation_).y * 0.01745329238474369,Y);
  Matrix4x4::rotation(&local_1b0,(this->rotation_).z * 0.01745329238474369,Z);
  local_468.x = (this->scale_).x;
  local_468.y = (this->scale_).y;
  local_468.z = (this->scale_).z;
  Matrix4x4::scaling(&local_468);
  Matrix4x4::operator*(&local_3b0,&local_430,&local_b0);
  Matrix4x4::operator*(&local_330,&local_3b0,&local_130);
  Matrix4x4::operator*(&local_2b0,&local_330,&local_1b0);
  Matrix4x4::operator*(__return_storage_ptr__,&local_2b0,&local_230);
  return __return_storage_ptr__;
}

Assistant:

Matrix4x4 getObjectToWorld() const {
   
        float deg2Rad = M_PI / 180.0;
    
        Matrix4x4 T = Matrix4x4::translation(position_);
        Matrix4x4 RX = Matrix4x4::rotation(rotation_.x * deg2Rad, Matrix4x4::Axis::X);
        Matrix4x4 RY = Matrix4x4::rotation(rotation_.y * deg2Rad, Matrix4x4::Axis::Y);
        Matrix4x4 RZ = Matrix4x4::rotation(rotation_.z * deg2Rad, Matrix4x4::Axis::Z);
        Matrix4x4 scaleXform = Matrix4x4::scaling(scale_);
    
        // object to world transformation
        Matrix4x4 objectToWorld = T * RX * RY * RZ * scaleXform;
        return objectToWorld;
    }